

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O2

void __thiscall rpn::RPNExpression::Push<rpn::FunctionRefExpression>(RPNExpression *this)

{
  _Head_base<0UL,_rpn::IExpression_*,_false> local_20;
  IExpression *local_18;
  
  std::make_unique<rpn::FunctionRefExpression>();
  local_20._M_head_impl = local_18;
  local_18 = (IExpression *)0x0;
  std::
  vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
  ::emplace_back<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>
            ((vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
              *)this,(unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *)
                     &local_20);
  if (local_20._M_head_impl != (IExpression *)0x0) {
    (*(local_20._M_head_impl)->_vptr_IExpression[1])();
  }
  local_20._M_head_impl = (IExpression *)0x0;
  if (local_18 != (IExpression *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }